

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

void __thiscall QToolBarAreaLayoutInfo::fitLayout(QToolBarAreaLayoutInfo *this)

{
  QToolBarAreaLayoutLine *this_00;
  long lVar1;
  bool bVar2;
  DockPosition DVar3;
  int iVar4;
  Representation RVar5;
  pointer pQVar6;
  QSize QVar7;
  DockPosition DVar8;
  long lVar9;
  QRect *pQVar10;
  long lVar11;
  long lVar12;
  
  this->dirty = false;
  DVar8 = this->dockPos & ~TopDock;
  DVar3 = this->dockPos | TopDock;
  if (DVar3 == BottomDock) {
    iVar4 = (int)(this->lines).d.size + -1;
  }
  else {
    iVar4 = 0;
  }
  if ((DVar8 != RightDock) || (-1 < iVar4)) {
    lVar1 = (ulong)(DVar8 != RightDock) * 2 + -1;
    lVar12 = (long)iVar4;
    lVar11 = lVar12 * 0x30;
    iVar4 = 0;
    do {
      if ((DVar3 != BottomDock) && (lVar12 == (this->lines).d.size)) {
        return;
      }
      pQVar6 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
      this_00 = (QToolBarAreaLayoutLine *)((long)&(pQVar6->rect).x1.m_i + lVar11);
      bVar2 = QToolBarAreaLayoutLine::skip(this_00);
      if (!bVar2) {
        if (this->o == Horizontal) {
          *(int *)((long)&(pQVar6->rect).x1.m_i + lVar11) = (this->rect).x1.m_i;
          *(int *)((long)&(pQVar6->rect).x2.m_i + lVar11) = (this->rect).x2.m_i;
          *(int *)((long)&(pQVar6->rect).y1.m_i + lVar11) = (this->rect).y1.m_i + iVar4;
          QVar7 = QToolBarAreaLayoutLine::sizeHint(this_00);
          RVar5 = QVar7.ht.m_i;
          lVar9 = 0xc;
          pQVar10 = (QRect *)&(this->rect).y1;
        }
        else {
          *(int *)((long)&(pQVar6->rect).y1.m_i + lVar11) = (this->rect).y1.m_i;
          *(int *)((long)&(pQVar6->rect).y2.m_i + lVar11) = (this->rect).y2.m_i;
          *(int *)((long)&(pQVar6->rect).x1.m_i + lVar11) = (this->rect).x1.m_i + iVar4;
          QVar7 = QToolBarAreaLayoutLine::sizeHint(this_00);
          RVar5 = QVar7.wd.m_i;
          lVar9 = 8;
          pQVar10 = &this->rect;
        }
        iVar4 = iVar4 + RVar5.m_i;
        *(int *)((long)&(pQVar6->rect).x1.m_i + lVar11 + lVar9) = (pQVar10->x1).m_i + iVar4 + -1;
        QToolBarAreaLayoutLine::fitLayout(this_00);
      }
      lVar12 = lVar12 + lVar1;
      lVar11 = lVar11 + lVar1 * 0x30;
    } while ((DVar8 != RightDock) || (-1 < lVar12));
  }
  return;
}

Assistant:

void QToolBarAreaLayoutInfo::fitLayout()
{
    dirty = false;

    int b = 0;

    bool reverse = dockPos == QInternal::RightDock || dockPos == QInternal::BottomDock;

    int i = reverse ? lines.size() - 1 : 0;
    for (;;) {
        if ((reverse && i < 0) || (!reverse && i == lines.size()))
            break;

        QToolBarAreaLayoutLine &l = lines[i];
        if (!l.skip()) {
            if (o == Qt::Horizontal) {
                l.rect.setLeft(rect.left());
                l.rect.setRight(rect.right());
                l.rect.setTop(b + rect.top());
                b += l.sizeHint().height();
                l.rect.setBottom(b - 1 + rect.top());
            } else {
                l.rect.setTop(rect.top());
                l.rect.setBottom(rect.bottom());
                l.rect.setLeft(b + rect.left());
                b += l.sizeHint().width();
                l.rect.setRight(b - 1 + rect.left());
            }

            l.fitLayout();
        }

        i += reverse ? -1 : 1;
    }
}